

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

void __thiscall chrono::ChSystem::SetTimestepperType(ChSystem *this,Type type)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChTimestepperHHT *pCVar3;
  Type TVar4;
  ChException *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined1 local_59;
  ChTimestepperHHT *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  ChSystem *local_48;
  string local_40;
  
  if (type == CUSTOM) {
    return;
  }
  TVar4 = (*((this->timestepper).
             super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ChTimestepper[2])();
  if (TVar4 == type) {
    return;
  }
  local_48 = this;
  switch(type) {
  case EULER_IMPLICIT_LINEARIZED:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperEulerImplicitLinearized,std::allocator<chrono::ChTimestepperEulerImplicitLinearized>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperEulerImplicitLinearized **)&local_58,
               (allocator<chrono::ChTimestepperEulerImplicitLinearized> *)&local_59,&local_48);
    break;
  case EULER_IMPLICIT_PROJECTED:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperEulerImplicitProjected,std::allocator<chrono::ChTimestepperEulerImplicitProjected>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperEulerImplicitProjected **)&local_58,
               (allocator<chrono::ChTimestepperEulerImplicitProjected> *)&local_59,&local_48);
    break;
  case EULER_IMPLICIT:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperEulerImplicit,std::allocator<chrono::ChTimestepperEulerImplicit>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperEulerImplicit **)&local_58,
               (allocator<chrono::ChTimestepperEulerImplicit> *)&local_59,&local_48);
    goto LAB_0051b7ce;
  case TRAPEZOIDAL:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperTrapezoidal,std::allocator<chrono::ChTimestepperTrapezoidal>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperTrapezoidal **)&local_58,
               (allocator<chrono::ChTimestepperTrapezoidal> *)&local_59,&local_48);
    goto LAB_0051b7ce;
  case TRAPEZOIDAL_LINEARIZED:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperTrapezoidalLinearized,std::allocator<chrono::ChTimestepperTrapezoidalLinearized>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperTrapezoidalLinearized **)&local_58,
               (allocator<chrono::ChTimestepperTrapezoidalLinearized> *)&local_59,&local_48);
    goto LAB_0051b7ce;
  case HHT:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperHHT,std::allocator<chrono::ChTimestepperHHT>,chrono::ChSystem*>
              (&_Stack_50,&local_58,(allocator<chrono::ChTimestepperHHT> *)&local_59,&local_48);
LAB_0051b7ce:
    _Var5._M_pi = _Stack_50._M_pi;
    pCVar3 = local_58;
    local_58 = (ChTimestepperHHT *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->timestepper).
             super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)pCVar3;
    (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
      }
      _Var5._M_pi = (this->timestepper).
                    super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
    peVar1 = (this->timestepper).
             super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (_Var5._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      *(undefined4 *)
       &peVar1[2].L.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           = 4;
      return;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var5._M_pi)->_M_use_count = (_Var5._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var5._M_pi)->_M_use_count = (_Var5._M_pi)->_M_use_count + 1;
    }
    *(undefined4 *)
     &peVar1[2].L.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         4;
    goto LAB_0051b8ff;
  case HEUN:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperHeun,std::allocator<chrono::ChTimestepperHeun>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperHeun **)&local_58,
               (allocator<chrono::ChTimestepperHeun> *)&local_59,&local_48);
    break;
  case RUNGEKUTTA45:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperRungeKuttaExpl,std::allocator<chrono::ChTimestepperRungeKuttaExpl>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperRungeKuttaExpl **)&local_58,
               (allocator<chrono::ChTimestepperRungeKuttaExpl> *)&local_59,&local_48);
    break;
  case EULER_EXPLICIT:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperEulerExplIIorder,std::allocator<chrono::ChTimestepperEulerExplIIorder>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperEulerExplIIorder **)&local_58,
               (allocator<chrono::ChTimestepperEulerExplIIorder> *)&local_59,&local_48);
    break;
  case LEAPFROG:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperLeapfrog,std::allocator<chrono::ChTimestepperLeapfrog>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperLeapfrog **)&local_58,
               (allocator<chrono::ChTimestepperLeapfrog> *)&local_59,&local_48);
    break;
  case NEWMARK:
    local_58 = (ChTimestepperHHT *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChTimestepperNewmark,std::allocator<chrono::ChTimestepperNewmark>,chrono::ChSystem*>
              (&_Stack_50,(ChTimestepperNewmark **)&local_58,
               (allocator<chrono::ChTimestepperNewmark> *)&local_59,&local_48);
    break;
  default:
    this_00 = (ChException *)__cxa_allocate_exception(0x28);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"SetTimestepperType: timestepper not supported","");
    ChException::ChException(this_00,&local_40);
    __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
  }
  _Var5._M_pi = _Stack_50._M_pi;
  pCVar3 = local_58;
  local_58 = (ChTimestepperHHT *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pCVar3;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
     _Var5._M_pi = _Stack_50._M_pi,
     _Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
LAB_0051b8ff:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
  }
  return;
}

Assistant:

void ChSystem::SetTimestepperType(ChTimestepper::Type type) {
    // Do nothing if changing to a CUSTOM timestepper.
    if (type == ChTimestepper::Type::CUSTOM)
        return;

    // Do nothing, if no change from current typestepper.
    if (type == GetTimestepperType())
        return;

    // Plug in the new required timestepper
    // (the previous will be automatically deallocated thanks to shared pointers)
    switch (type) {
        case ChTimestepper::Type::EULER_IMPLICIT:
            timestepper = chrono_types::make_shared<ChTimestepperEulerImplicit>(this);
            std::static_pointer_cast<ChTimestepperEulerImplicit>(timestepper)->SetMaxiters(4);
            break;
        case ChTimestepper::Type::EULER_IMPLICIT_LINEARIZED:
            timestepper = chrono_types::make_shared<ChTimestepperEulerImplicitLinearized>(this);
            break;
        case ChTimestepper::Type::EULER_IMPLICIT_PROJECTED:
            timestepper = chrono_types::make_shared<ChTimestepperEulerImplicitProjected>(this);
            break;
        case ChTimestepper::Type::TRAPEZOIDAL:
            timestepper = chrono_types::make_shared<ChTimestepperTrapezoidal>(this);
            std::static_pointer_cast<ChTimestepperTrapezoidal>(timestepper)->SetMaxiters(4);
            break;
        case ChTimestepper::Type::TRAPEZOIDAL_LINEARIZED:
            timestepper = chrono_types::make_shared<ChTimestepperTrapezoidalLinearized>(this);
            std::static_pointer_cast<ChTimestepperTrapezoidalLinearized>(timestepper)->SetMaxiters(4);
            break;
        case ChTimestepper::Type::HHT:
            timestepper = chrono_types::make_shared<ChTimestepperHHT>(this);
            std::static_pointer_cast<ChTimestepperHHT>(timestepper)->SetMaxiters(4);
            break;
        case ChTimestepper::Type::HEUN:
            timestepper = chrono_types::make_shared<ChTimestepperHeun>(this);
            break;
        case ChTimestepper::Type::RUNGEKUTTA45:
            timestepper = chrono_types::make_shared<ChTimestepperRungeKuttaExpl>(this);
            break;
        case ChTimestepper::Type::EULER_EXPLICIT:
            timestepper = chrono_types::make_shared<ChTimestepperEulerExplIIorder>(this);
            break;
        case ChTimestepper::Type::LEAPFROG:
            timestepper = chrono_types::make_shared<ChTimestepperLeapfrog>(this);
            break;
        case ChTimestepper::Type::NEWMARK:
            timestepper = chrono_types::make_shared<ChTimestepperNewmark>(this);
            break;
        default:
            throw ChException("SetTimestepperType: timestepper not supported");
    }
}